

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O3

void __thiscall jsoncons::detail::chars_to::chars_to(chars_to *this)

{
  char cVar1;
  lconv *plVar2;
  
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  plVar2 = localeconv();
  if ((plVar2 == (lconv *)0x0) || (cVar1 = *plVar2->decimal_point, cVar1 == '\0')) {
    cVar1 = '.';
  }
  this->decimal_point_ = cVar1;
  std::vector<char,_std::allocator<char>_>::reserve(&this->buffer_,100);
  return;
}

Assistant:

chars_to()
        : buffer_()
    {
        struct lconv * lc = localeconv();
        if (lc != nullptr && lc->decimal_point[0] != 0)
        {
            decimal_point_ = lc->decimal_point[0];    
        }
        else
        {
            decimal_point_ = '.'; 
        }
        buffer_.reserve(100);
    }